

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc.h
# Opt level: O2

void foreach_overlappable_nb_left
               (AV1_COMMON *cm,MACROBLOCKD *xd,int nb_max,overlappable_nb_visitor_t fun,
               void *fun_ctxt)

{
  uint8_t uVar1;
  uint uVar2;
  MB_MODE_INFO **ppMVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  MB_MODE_INFO *pMVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  
  if (xd->left_available == true) {
    uVar1 = cm->seq_params->monochrome;
    uVar2 = xd->mi_row;
    ppMVar3 = xd->mi;
    lVar6 = (long)xd->mi_stride * (long)(int)uVar2;
    iVar12 = xd->height + uVar2;
    iVar11 = (cm->mi_params).mi_rows;
    if (iVar11 <= iVar12) {
      iVar12 = iVar11;
    }
    iVar11 = 0;
    uVar10 = uVar2;
    while (((int)uVar10 < iVar12 && (iVar11 < nb_max))) {
      pMVar9 = ppMVar3[((long)(int)(xd->mi_stride * uVar10) + -1) - lVar6];
      uVar8 = (ulong)pMVar9->bsize;
      bVar4 = 0x10;
      uVar7 = uVar10;
      if ((0x2f0bffUL >> (uVar8 & 0x3f) & 1) != 0) {
        if ((0x20005UL >> (uVar8 & 0x3f) & 1) == 0) {
          bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [uVar8];
        }
        else {
          uVar7 = uVar10 & 0xfffffffe;
          pMVar9 = ppMVar3[((long)(int)(xd->mi_stride * (uVar10 | 1)) + -1) - lVar6];
          bVar4 = 2;
        }
      }
      if (((pMVar9->field_0xa7 & 0x80) != 0) || ('\0' < pMVar9->ref_frame[0])) {
        iVar11 = iVar11 + 1;
        bVar5 = xd->height;
        if (bVar4 <= xd->height) {
          bVar5 = bVar4;
        }
        (*fun)(xd,uVar7 - uVar2,0,bVar5,1,pMVar9,fun_ctxt,SUB14(uVar1 == '\0',0) * 2 + 1);
      }
      uVar10 = uVar7 + bVar4;
    }
  }
  return;
}

Assistant:

static inline void foreach_overlappable_nb_left(const AV1_COMMON *cm,
                                                MACROBLOCKD *xd, int nb_max,
                                                overlappable_nb_visitor_t fun,
                                                void *fun_ctxt) {
  if (!xd->left_available) return;

  const int num_planes = av1_num_planes(cm);
  int nb_count = 0;
  // prev_col_mi points into the mi array, starting at the top of the
  // previous column
  const int mi_row = xd->mi_row;
  MB_MODE_INFO **prev_col_mi = xd->mi - 1 - mi_row * xd->mi_stride;
  const int end_row = AOMMIN(mi_row + xd->height, cm->mi_params.mi_rows);
  uint8_t mi_step;
  for (int left_mi_row = mi_row; left_mi_row < end_row && nb_count < nb_max;
       left_mi_row += mi_step) {
    MB_MODE_INFO **left_mi = prev_col_mi + left_mi_row * xd->mi_stride;
    mi_step =
        AOMMIN(mi_size_high[left_mi[0]->bsize], mi_size_high[BLOCK_64X64]);
    if (mi_step == 1) {
      left_mi_row &= ~1;
      left_mi = prev_col_mi + (left_mi_row + 1) * xd->mi_stride;
      mi_step = 2;
    }
    if (is_neighbor_overlappable(*left_mi)) {
      ++nb_count;
      fun(xd, left_mi_row - mi_row, 0, AOMMIN(xd->height, mi_step), 1, *left_mi,
          fun_ctxt, num_planes);
    }
  }
}